

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

StringPtr * __thiscall
kj::
Table<kj::TreeMap<kj::String,_int>::Entry,_kj::TreeIndex<kj::TreeMap<kj::String,_int>::Callbacks>_>
::insert(Table<kj::TreeMap<kj::String,_int>::Entry,_kj::TreeIndex<kj::TreeMap<kj::String,_int>::Callbacks>_>
         *this,StringPtr *row)

{
  StringPtr *pSVar1;
  undefined8 *puVar2;
  size_t newSize;
  Impl<0UL,_false> local_28 [16];
  
  Impl<0UL,_false>::insert
            (local_28,(Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                       *)this,*(long *)(this + 8) - *(long *)this >> 5,row,0xffffffff);
  if (local_28[0] != (Impl<0UL,_false>)0x1) {
    puVar2 = *(undefined8 **)(this + 8);
    if (puVar2 == *(undefined8 **)(this + 0x10)) {
      newSize = 4;
      if (puVar2 != *(undefined8 **)this) {
        newSize = (long)puVar2 - (long)*(undefined8 **)this >> 4;
      }
      Vector<kj::TreeMap<kj::String,_int>::Entry>::setCapacity
                ((Vector<kj::TreeMap<kj::String,_int>::Entry> *)this,newSize);
      puVar2 = *(undefined8 **)(this + 8);
    }
    *puVar2 = (row->content).ptr;
    puVar2[1] = (row->content).size_;
    puVar2[2] = row[1].content.ptr;
    (row->content).ptr = (char *)0x0;
    (row->content).size_ = 0;
    *(int *)(puVar2 + 3) = (int)row[1].content.size_;
    pSVar1 = *(StringPtr **)(this + 8);
    *(StringPtr **)(this + 8) = pSVar1 + 2;
    return pSVar1;
  }
  _::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  if (kj::none != Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }
}